

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O0

int av1_selfguided_restoration_sse4_1
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  int buf_stride_00;
  int iVar1;
  int32_t *B_00;
  undefined4 in_ECX;
  undefined8 unaff_RBX;
  int in_ESI;
  int32_t *in_RDI;
  undefined8 in_R8;
  int32_t *in_R9;
  int unaff_retaddr;
  int unaff_retaddr_00;
  uint16_t *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000020;
  sgr_params_type *params;
  uint8_t *dgd0;
  int dgd_diag_border;
  int32_t *D;
  int32_t *C;
  int32_t *B;
  int32_t *A;
  int32_t *D0;
  int32_t *C0;
  int32_t *B0;
  int32_t *A0;
  int buf_diag_border;
  int32_t *Dtl;
  int32_t *Ctl;
  int32_t *Btl;
  int32_t *Atl;
  int in_stack_000000a8;
  int buf_stride;
  int height_ext;
  int width_ext;
  int32_t *buf;
  int in_stack_000001c0;
  int in_stack_000001c8;
  int in_stack_000001d0;
  int in_stack_000001d8;
  int in_stack_00000350;
  int in_stack_00000358;
  int in_stack_00000360;
  int in_stack_00000368;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  size_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffffb0;
  int dst_stride;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  
  dst_stride = (int)((ulong)in_R8 >> 0x20);
  iVar2 = (int)((ulong)unaff_RBX >> 0x20);
  B_00 = (int32_t *)
         aom_memalign(in_stack_ffffffffffffff28,
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (B_00 == (int32_t *)0x0) {
    iVar2 = -1;
  }
  else {
    memset(B_00,0,0x1fa40);
    buf_stride_00 = in_ESI + 6;
    iVar1 = (in_ESI + 9U & 0xfffffffc) + 0x10;
    if (in_stack_00000020 == 0) {
      integral_images((uint8_t *)in_stack_00000008,unaff_retaddr_00,unaff_retaddr,iVar2,
                      (int32_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                      in_RDI,bit_depth);
    }
    else {
      integral_images_highbd
                (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,iVar2,
                 (int32_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI,
                 bit_depth);
    }
    if (0 < av1_sgr_params[in_stack_00000010].r[0]) {
      calc_ab_fast(buf,_height_ext,(int32_t *)CONCAT44(buf_stride,in_stack_000000a8),
                   (int32_t *)CONCAT44(Atl._4_4_,(int)Atl),Btl._4_4_,(int)Btl,in_stack_00000350,
                   in_stack_00000358,in_stack_00000360,in_stack_00000368);
      in_stack_ffffffffffffff10 = in_ESI;
      final_filter_fast(C0,D0._4_4_,A,B,C._4_4_,D,in_stack_000001c0,in_stack_000001c8,
                        in_stack_000001d0,in_stack_000001d8);
    }
    if (0 < av1_sgr_params[in_stack_00000010].r[1]) {
      calc_ab(buf,_height_ext,(int32_t *)CONCAT44(buf_stride,in_stack_000000a8),
              (int32_t *)CONCAT44(Atl._4_4_,(int)Atl),Btl._4_4_,(int)Btl,in_stack_00000350,
              in_stack_00000358,in_stack_00000360,in_stack_00000368);
      final_filter((int32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),dst_stride,in_R9,B_00,
                   buf_stride_00,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),(int)Ctl,(int)Btl
                   ,(int)Atl,in_stack_000000a8);
      in_stack_ffffffffffffff10 = in_ESI;
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int av1_selfguided_restoration_sse4_1(const uint8_t *dgd8, int width,
                                      int height, int dgd_stride, int32_t *flt0,
                                      int32_t *flt1, int flt_stride,
                                      int sgr_params_idx, int bit_depth,
                                      int highbd) {
  int32_t *buf = (int32_t *)aom_memalign(
      16, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);
  if (!buf) return -1;
  memset(buf, 0, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes for efficiency.
  int buf_stride = ((width_ext + 3) & ~3) + 16;

  // The "tl" pointers point at the top-left of the initialised data for the
  // array. Adding 3 here ensures that column 1 is 16-byte aligned.
  int32_t *Atl = buf + 0 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Btl = buf + 1 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Ctl = buf + 2 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Dtl = buf + 3 * RESTORATION_PROC_UNIT_PELS + 3;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}